

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.hpp
# Opt level: O3

int __thiscall
mcts::RandomPlayout<uttt::IBoard>::operator()(RandomPlayout<uttt::IBoard> *this,IBoard *game)

{
  int iVar1;
  result_type_conflict1 rVar2;
  uint uVar3;
  ulong uVar4;
  size_t __i;
  long lVar5;
  vector<long,_std::allocator<long>_> moves;
  IBoard ngame;
  param_type local_68;
  vector<long,_std::allocator<long>_> local_60;
  IBoard local_48;
  
  if ((operator()(uttt::IBoard_const&)::rd == '\0') &&
     (iVar1 = __cxa_guard_acquire(&operator()(uttt::IBoard_const&)::rd), iVar1 != 0)) {
    std::random_device::random_device(&operator()::rd);
    __cxa_atexit(std::random_device::~random_device,&operator()::rd,&__dso_handle);
    __cxa_guard_release(&operator()(uttt::IBoard_const&)::rd);
  }
  if ((operator()(uttt::IBoard_const&)::gen == '\0') &&
     (iVar1 = __cxa_guard_acquire(&operator()(uttt::IBoard_const&)::gen), iVar1 != 0)) {
    uVar3 = std::random_device::_M_getval();
    uVar4 = (ulong)uVar3;
    lVar5 = 1;
    operator()::gen._M_x[0] = uVar4;
    do {
      uVar4 = (ulong)(((uint)(uVar4 >> 0x1e) ^ (uint)uVar4) * 0x6c078965 + (int)lVar5);
      operator()::gen._M_x[lVar5] = uVar4;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x270);
    operator()::gen._M_p = 0x270;
    __cxa_guard_release(&operator()(uttt::IBoard_const&)::gen);
  }
  local_48._16_8_ = *(undefined8 *)((game->micro)._M_elems + 6);
  local_48.macro = game->macro;
  local_48.micro._M_elems[0] = (game->micro)._M_elems[0];
  local_48.micro._M_elems[1] = (game->micro)._M_elems[1];
  local_48.micro._M_elems._4_8_ = *(undefined8 *)((game->micro)._M_elems + 2);
  iVar1 = uttt::IBoard::GetStatus(&local_48);
  if (iVar1 == -1) {
    do {
      uttt::IBoard::GetPossibleMoves(&local_60,&local_48);
      local_68._M_b =
           (int)((ulong)((long)local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3) + -1;
      local_68._M_a = 0;
      rVar2 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&local_68,&operator()::gen,&local_68);
      uttt::IBoard::ApplyMove
                (&local_48,
                 local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start + rVar2);
      iVar1 = uttt::IBoard::GetStatus(&local_48);
      if (local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    } while (iVar1 == -1);
  }
  return iVar1;
}

Assistant:

int
RandomPlayout<IGame>::operator()(const IGame &game) const
{
    static std::random_device rd;
    static std::mt19937 gen(rd());

    auto ngame(game);
    int status = ngame.GetStatus();
    while (status == game::Undecided)
    {
        auto moves = ngame.GetPossibleMoves();
        ngame.ApplyMove(moves[std::uniform_int_distribution<>(0, moves.size() - 1)(gen)]);
        status = ngame.GetStatus();
    }
    return status;
}